

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::StrPair::CollapseWhitespace(StrPair *this)

{
  char *pcVar1;
  char p;
  bool bVar2;
  char *p_00;
  char *pcVar3;
  
  p_00 = XMLUtil::SkipWhiteSpace(this->_start);
  this->_start = p_00;
  p = *p_00;
  pcVar3 = p_00;
  if (p != '\0') {
    while (p != '\0') {
      bVar2 = XMLUtil::IsWhiteSpace(p);
      if (bVar2) {
        p_00 = XMLUtil::SkipWhiteSpace(p_00);
        if (*p_00 == '\0') break;
        *pcVar3 = ' ';
        pcVar3 = pcVar3 + 1;
      }
      *pcVar3 = *p_00;
      pcVar1 = p_00 + 1;
      p_00 = p_00 + 1;
      pcVar3 = pcVar3 + 1;
      p = *pcVar1;
    }
    *pcVar3 = '\0';
  }
  return;
}

Assistant:

void StrPair::CollapseWhitespace()
{
    // Adjusting _start would cause undefined behavior on delete[]
    TIXMLASSERT( ( _flags & NEEDS_DELETE ) == 0 );
    // Trim leading space.
    _start = XMLUtil::SkipWhiteSpace( _start );

    if ( *_start ) {
        char* p = _start;	// the read pointer
        char* q = _start;	// the write pointer

        while( *p ) {
            if ( XMLUtil::IsWhiteSpace( *p )) {
                p = XMLUtil::SkipWhiteSpace( p );
                if ( *p == 0 ) {
                    break;    // don't write to q; this trims the trailing space.
                }
                *q = ' ';
                ++q;
            }
            *q = *p;
            ++q;
            ++p;
        }
        *q = 0;
    }
}